

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,int v)

{
  Value local_28;
  int local_14;
  SampleBuilder *pSStack_10;
  int v_local;
  SampleBuilder *this_local;
  
  local_14 = v;
  pSStack_10 = this;
  Value::Value(&local_28,(long)v);
  std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::push_back
            (&this->m_values,&local_28);
  return this;
}

Assistant:

SampleBuilder&			operator<<			(int v)		{ m_values.push_back(Value((deInt64)v));	return *this; }